

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log10f.h
# Opt level: O1

float log10f_2(float x)

{
  float fVar1;
  int E;
  int local_c;
  
  fVar1 = frexpf(ABS(x),&local_c);
  return (fVar1 * ((fVar1 * 1.2314959 + -4.118525) * fVar1 + 6.0219703) + -3.1339645 +
         (float)local_c) * 0.30103;
}

Assistant:

float log10f_2(const float x)
{
    float Y, F;
    int E;
    F = frexpf(fabsf(x), &E);
    Y = 1.23149591368684f;
    Y *= F;
    Y += -4.11852516267426f;
    Y *= F;
    Y += 6.02197014179219f;
    Y *= F;
    Y += -3.13396450166353f;
    Y += E;
    return (Y * ONE_OVER_LOG2_10);
}